

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_unix.cpp
# Opt level: O0

int prepareQueryBuffer(res_state state,QueryBuffer *buffer,char *label,ns_rcode type)

{
  unsigned_short uVar1;
  uint uVar2;
  pointer pvVar3;
  size_type sVar4;
  undefined4 in_ECX;
  undefined8 in_RDX;
  array<unsigned_char,_288UL> *in_RSI;
  unsigned_long in_RDI;
  int queryLength;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  pvVar3 = std::array<unsigned_char,_288UL>::data((array<unsigned_char,_288UL> *)0x36204d);
  sVar4 = std::array<unsigned_char,_288UL>::size(in_RSI);
  local_4 = res_nmkquery(in_RDI,0,in_RDX,1,in_ECX,0,0,0,pvVar3,(int)sVar4);
  if (-1 < local_4) {
    std::begin<unsigned_char_const,11ul>((uchar (*) [11])"");
    std::array<unsigned_char,_288UL>::begin((array<unsigned_char,_288UL> *)0x3620d3);
    std::copy_n<unsigned_char_const*,unsigned_long,unsigned_char*>
              ((uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8),in_RDI,
               (uchar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    uVar1 = qToBigEndian<unsigned_short>(0);
    uVar2 = (uint)uVar1;
    pvVar3 = std::array<unsigned_char,_288UL>::data((array<unsigned_char,_288UL> *)0x362108);
    *(uint *)(pvVar3 + 8) = *(uint *)(pvVar3 + 8) & 0xffff | uVar2 << 0x10;
    local_4 = local_4 + 0xb;
  }
  return local_4;
}

Assistant:

static int
prepareQueryBuffer(res_state state, QueryBuffer &buffer, const char *label, ns_rcode type)
{
    // Create header and our query
    int queryLength = res_nmkquery(state, QUERY, label, C_IN, type, nullptr, 0, nullptr,
                                   buffer.data(), buffer.size());
    Q_ASSERT(queryLength < int(buffer.size()));
    if (Q_UNLIKELY(queryLength < 0))
        return queryLength;

    // Append EDNS0 record and set the number of additional RRs to 1
    Q_ASSERT(queryLength + sizeof(Edns0Record) < buffer.size());
    std::copy_n(std::begin(Edns0Record), sizeof(Edns0Record), buffer.begin() + queryLength);
    reinterpret_cast<HEADER *>(buffer.data())->arcount = qToBigEndian<quint16>(1);

    return queryLength + sizeof(Edns0Record);
}